

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String __thiscall
testing::internal::AppendUserMessage(internal *this,String *gtest_msg,Message *user_msg)

{
  bool bVar1;
  Message *pMVar2;
  size_t extraout_RDX;
  String SVar3;
  Message local_48;
  Message msg;
  undefined1 local_30 [8];
  String user_msg_string;
  Message *user_msg_local;
  String *gtest_msg_local;
  
  user_msg_string.length_ = (size_t)user_msg;
  Message::GetString((Message *)local_30);
  bVar1 = String::empty((String *)local_30);
  if (bVar1) {
    String::String((String *)this,gtest_msg);
    msg.ss_.ptr_._0_4_ = 1;
  }
  else {
    Message::Message(&local_48);
    pMVar2 = Message::operator<<(&local_48,gtest_msg);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x1f6527);
    Message::operator<<(pMVar2,(String *)local_30);
    Message::GetString((Message *)this);
    msg.ss_.ptr_._0_4_ = 1;
    Message::~Message(&local_48);
  }
  String::~String((String *)local_30);
  SVar3.length_ = extraout_RDX;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String AppendUserMessage(const String& gtest_msg,
                         const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const String user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }

  Message msg;
  msg << gtest_msg << "\n" << user_msg_string;

  return msg.GetString();
}